

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::ExclusiveBetweenOperator,false,true,false>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  sel_t *psVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  
  if (count == 0) {
    iVar12 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    puVar5 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar6 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar7 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    psVar8 = true_sel->sel_vector;
    iVar12 = 0;
    uVar18 = 0;
    do {
      uVar20 = uVar18;
      if (psVar1 != (sel_t *)0x0) {
        uVar20 = (ulong)psVar1[uVar18];
      }
      uVar11 = uVar18;
      if (psVar2 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar2[uVar18];
      }
      uVar13 = uVar18;
      if (psVar3 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar3[uVar18];
      }
      uVar16 = uVar18;
      if (psVar4 != (sel_t *)0x0) {
        uVar16 = (ulong)psVar4[uVar18];
      }
      if ((((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
          && ((puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)
              ))) &&
         ((puVar7 == (unsigned_long *)0x0 || ((puVar7[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0))))
      {
        lVar10._0_4_ = adata[uVar11].months;
        lVar10._4_4_ = adata[uVar11].days;
        lVar15._0_4_ = bdata[uVar13].months;
        lVar15._4_4_ = bdata[uVar13].days;
        lVar14 = (lVar10 >> 0x20) + adata[uVar11].micros / 86400000000;
        lVar19 = adata[uVar11].micros % 86400000000;
        lVar9 = lVar14 % 0x1e;
        lVar17 = (long)(int)(undefined4)lVar10 + lVar14 / 0x1e;
        lVar14 = (lVar15 >> 0x20) + bdata[uVar13].micros / 86400000000;
        lVar10 = lVar14 % 0x1e;
        lVar15 = (long)(int)(undefined4)lVar15 + lVar14 / 0x1e;
        lVar14._0_4_ = cdata[uVar16].months;
        lVar14._4_4_ = cdata[uVar16].days;
        if (lVar15 < lVar17) {
LAB_00edda7f:
          lVar10 = (lVar14 >> 0x20) + cdata[uVar16].micros / 86400000000;
          lVar15 = lVar10 % 0x1e;
          lVar10 = (long)(int)(undefined4)lVar14 + lVar10 / 0x1e;
          uVar11 = 1;
          if (lVar10 <= lVar17) {
            if (lVar10 < lVar17) goto LAB_00eddb0e;
            if (lVar15 <= lVar9) {
              uVar11 = (ulong)(lVar19 < cdata[uVar16].micros % 86400000000 && lVar9 <= lVar15);
            }
          }
        }
        else {
          if (lVar17 < lVar15) goto LAB_00eddb0e;
          if (lVar10 < lVar9) goto LAB_00edda7f;
          if (lVar9 < lVar10) goto LAB_00eddb0e;
          uVar11 = 0;
          if (bdata[uVar13].micros % 86400000000 < lVar19) goto LAB_00edda7f;
        }
      }
      else {
LAB_00eddb0e:
        uVar11 = 0;
      }
      psVar8[iVar12] = (sel_t)uVar20;
      iVar12 = uVar11 + iVar12;
      uVar18 = uVar18 + 1;
    } while (count != uVar18);
  }
  return iVar12;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}